

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O0

EC_T_BOOL CAtEmLogging::OsDbgMsgHookWrapper(EC_T_CHAR *szFormat,__va_list_tag *vaArgs)

{
  undefined4 local_1c;
  EC_T_BOOL bPrint;
  __va_list_tag *vaArgs_local;
  EC_T_CHAR *szFormat_local;
  
  local_1c = 1;
  if (G_pOsDbgMsgLoggingInst != (CAtEmLogging *)0x0) {
    local_1c = OsDbgMsgHook(G_pOsDbgMsgLoggingInst,szFormat,vaArgs);
  }
  if (local_1c != 0) {
    vprintf(szFormat,vaArgs);
  }
  return 0;
}

Assistant:

EC_T_BOOL CAtEmLogging::OsDbgMsgHookWrapper(const EC_T_CHAR* szFormat, EC_T_VALIST vaArgs)
{
EC_T_BOOL bPrint = EC_TRUE;

    if (EC_NULL != G_pOsDbgMsgLoggingInst)
    {
        bPrint = G_pOsDbgMsgLoggingInst->OsDbgMsgHook(szFormat, vaArgs);
    }
    if (bPrint)
    {
        OsVprintf(szFormat, vaArgs);
    }
    return EC_FALSE;
}